

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O1

void __thiscall
spvtools::opt::LoopFissionImpl::TraverseUseDef
          (LoopFissionImpl *this,Instruction *inst,
          set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *returned_set,bool ignore_phi_users,bool report_loads)

{
  IRContext *this_00;
  DefUseManager *pDVar1;
  Instruction *local_58;
  _Any_data local_50;
  code *local_40;
  code *pcStack_38;
  
  if (returned_set !=
      (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       *)0x0) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    pDVar1 = (this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    local_50._M_unused._M_object = operator_new(0x28);
    *(LoopFissionImpl **)local_50._M_unused._0_8_ = this;
    *(DefUseManager **)((long)local_50._M_unused._0_8_ + 8) = pDVar1;
    *(set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
      **)((long)local_50._M_unused._0_8_ + 0x10) = returned_set;
    *(_Any_data **)((long)local_50._M_unused._0_8_ + 0x18) = &local_50;
    *(bool *)((long)local_50._M_unused._0_8_ + 0x20) = ignore_phi_users;
    *(bool *)((long)local_50._M_unused._0_8_ + 0x21) = report_loads;
    local_50._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp:131:23)>
               ::_M_manager;
    pcStack_38 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp:131:23)>
                 ::_M_invoke;
    local_58 = inst;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp:131:23)>
    ::_M_invoke(&local_50,&local_58);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,3);
    }
    return;
  }
  __assert_fail("returned_set && \"Set to be returned cannot be null.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp"
                ,0x7a,
                "void spvtools::opt::LoopFissionImpl::TraverseUseDef(Instruction *, std::set<Instruction *> *, bool, bool)"
               );
}

Assistant:

void LoopFissionImpl::TraverseUseDef(Instruction* inst,
                                     std::set<Instruction*>* returned_set,
                                     bool ignore_phi_users, bool report_loads) {
  assert(returned_set && "Set to be returned cannot be null.");

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();
  std::set<Instruction*>& inst_set = *returned_set;

  // We create this functor to traverse the use def chain to build the
  // grouping of related instructions. The lambda captures the std::function
  // to allow it to recurse.
  std::function<void(Instruction*)> traverser_functor;
  traverser_functor = [this, def_use, &inst_set, &traverser_functor,
                       ignore_phi_users, report_loads](Instruction* user) {
    // If we've seen the instruction before or it is not inside the loop end the
    // traversal.
    if (!user || seen_instructions_.count(user) != 0 ||
        !context_->get_instr_block(user) ||
        !loop_->IsInsideLoop(context_->get_instr_block(user))) {
      return;
    }

    // Don't include labels or loop merge instructions in the instruction sets.
    // Including them would mean we group instructions related only by using the
    // same labels (i.e phis). We already preempt the inclusion of
    // OpSelectionMerge by adding related instructions to the seen_instructions_
    // set.
    if (user->opcode() == spv::Op::OpLoopMerge ||
        user->opcode() == spv::Op::OpLabel)
      return;

    // If the |report_loads| flag is set, set the class field
    // load_used_in_condition_ to false. This is used to check that none of the
    // condition checks in the loop rely on loads.
    if (user->opcode() == spv::Op::OpLoad && report_loads) {
      load_used_in_condition_ = true;
    }

    // Add the instruction to the set of instructions already seen, this breaks
    // recursion and allows us to ignore certain instructions.
    seen_instructions_.insert(user);

    inst_set.insert(user);

    // Wrapper functor to traverse the operands of each instruction.
    auto traverse_operand = [&traverser_functor, def_use](const uint32_t* id) {
      traverser_functor(def_use->GetDef(*id));
    };
    user->ForEachInOperand(traverse_operand);

    // For the first traversal we want to ignore the users of the phi.
    if (ignore_phi_users && user->opcode() == spv::Op::OpPhi) return;

    // Traverse each user with this lambda.
    def_use->ForEachUser(user, traverser_functor);

    // Wrapper functor for the use traversal.
    auto traverse_use = [&traverser_functor](Instruction* use, uint32_t) {
      traverser_functor(use);
    };
    def_use->ForEachUse(user, traverse_use);

  };

  // We start the traversal of the use def graph by invoking the above
  // lambda with the |inst| parameter.
  traverser_functor(inst);
}